

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

BlockEntry * __thiscall mkvparser::Cluster::GetEntry(Cluster *this,CuePoint *cp,TrackPosition *tp)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  longlong lVar6;
  Track *pTVar7;
  BlockEntry *pBVar8;
  BlockEntry *pBVar9;
  long len;
  longlong pos;
  long local_40;
  longlong local_38;
  Block *this_00;
  
  lVar1 = cp->m_timecode;
  pBVar9 = (BlockEntry *)tp->m_block;
  if (0 < (long)pBVar9) {
    do {
      if ((long)pBVar9 <= this->m_entries_count) {
        pBVar9 = this->m_entries[(long)((long)&pBVar9[-1].m_index + 7)];
        iVar3 = (*pBVar9->_vptr_BlockEntry[2])(pBVar9);
        if ((((Block *)CONCAT44(extraout_var,iVar3))->m_track != tp->m_track) ||
           (lVar6 = Block::GetTimeCode((Block *)CONCAT44(extraout_var,iVar3),this), lVar6 != lVar1))
        {
          bVar2 = true;
          goto LAB_0015e31f;
        }
        bVar2 = false;
        goto LAB_0015e322;
      }
      lVar4 = Parse(this,&local_38,&local_40);
    } while ((-1 < lVar4) && (lVar4 == 0));
    bVar2 = false;
LAB_0015e31f:
    pBVar9 = (BlockEntry *)0x0;
LAB_0015e322:
    if (!bVar2) {
      return pBVar9;
    }
  }
  lVar4 = 0;
  do {
    if ((this->m_entries_count <= lVar4) && (lVar5 = Parse(this,&local_38,&local_40), lVar5 != 0)) {
      return (BlockEntry *)0x0;
    }
    pBVar8 = this->m_entries[lVar4];
    iVar3 = (*pBVar8->_vptr_BlockEntry[2])(pBVar8);
    this_00 = (Block *)CONCAT44(extraout_var_00,iVar3);
    if ((this_00->m_track == tp->m_track) &&
       (lVar6 = Block::GetTimeCode(this_00,this), lVar1 <= lVar6)) {
      if ((lVar1 < lVar6) ||
         (pTVar7 = Tracks::GetTrackByNumber(this->m_pSegment->m_pTracks,tp->m_track),
         pTVar7 == (Track *)0x0)) {
LAB_0015e3ba:
        bVar2 = false;
        pBVar8 = (BlockEntry *)0x0;
      }
      else {
        lVar5 = (pTVar7->m_info).type;
        if (lVar5 == 1) {
          if (-1 < (char)this_00->m_flags) {
            pBVar8 = (BlockEntry *)0x0;
          }
        }
        else if (lVar5 != 2) goto LAB_0015e3ba;
        bVar2 = false;
      }
    }
    else {
      lVar4 = lVar4 + 1;
      bVar2 = true;
      pBVar8 = pBVar9;
    }
    pBVar9 = pBVar8;
    if (!bVar2) {
      return pBVar8;
    }
  } while( true );
}

Assistant:

const BlockEntry* Cluster::GetEntry(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) const {
  assert(m_pSegment);
  const long long tc = cp.GetTimeCode();

  if (tp.m_block > 0) {
    const long block = static_cast<long>(tp.m_block);
    const long index = block - 1;

    while (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if ((pBlock->GetTrackNumber() == tp.m_track) &&
        (pBlock->GetTimeCode(this) == tc)) {
      return pEntry;
    }
  }

  long index = 0;

  for (;;) {
    if (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;

      assert(m_entries);
      assert(index < m_entries_count);
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if (pBlock->GetTrackNumber() != tp.m_track) {
      ++index;
      continue;
    }

    const long long tc_ = pBlock->GetTimeCode(this);

    if (tc_ < tc) {
      ++index;
      continue;
    }

    if (tc_ > tc)
      return NULL;

    const Tracks* const pTracks = m_pSegment->GetTracks();
    assert(pTracks);

    const long tn = static_cast<long>(tp.m_track);
    const Track* const pTrack = pTracks->GetTrackByNumber(tn);

    if (pTrack == NULL)
      return NULL;

    const long long type = pTrack->GetType();

    if (type == 2)  // audio
      return pEntry;

    if (type != 1)  // not video
      return NULL;

    if (!pBlock->IsKey())
      return NULL;

    return pEntry;
  }
}